

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O2

IOTHUB_REGISTRYMANAGER_RESULT
parseDeviceOrModuleJson(BUFFER_HANDLE jsonBuffer,IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo)

{
  IOTHUB_REGISTRYMANAGER_RESULT IVar1;
  JSON_Status JVar2;
  uchar *puVar3;
  JSON_Value *value;
  JSON_Object *root_object;
  LOGGER_LOG p_Var4;
  int iVar5;
  char *pcVar6;
  
  if (deviceOrModuleInfo == (IOTHUB_DEVICE_OR_MODULE *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
              ,"parseDeviceOrModuleJson",0x2ce,1,"deviceOrModuleInfo cannot be NULL");
    return IOTHUB_REGISTRYMANAGER_JSON_ERROR;
  }
  puVar3 = BUFFER_u_char(jsonBuffer);
  IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
  if (puVar3 == (uchar *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      pcVar6 = "BUFFER_u_char failed";
      iVar5 = 0x2da;
LAB_00136646:
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"parseDeviceOrModuleJson",iVar5,1,pcVar6);
    }
  }
  else {
    value = json_parse_string((char *)0x136574);
    if (value != (JSON_Value *)0x0) {
      root_object = json_value_get_object(value);
      if (root_object == (JSON_Object *)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) {
          root_object = (JSON_Object *)0x0;
        }
        else {
          root_object = (JSON_Object *)0x0;
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                    ,"parseDeviceOrModuleJson",0x2e4,1,"json_value_get_object failed");
        }
      }
      else {
        IVar1 = parseDeviceOrModuleJsonObject(root_object,deviceOrModuleInfo);
      }
      goto LAB_00136653;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      pcVar6 = "json_parse_string failed";
      iVar5 = 0x2df;
      goto LAB_00136646;
    }
  }
  root_object = (JSON_Object *)0x0;
  value = (JSON_Value *)0x0;
LAB_00136653:
  JVar2 = json_object_clear(root_object);
  if (JVar2 != 0) {
    p_Var4 = xlogging_get_log_function();
    IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"parseDeviceOrModuleJson",0x2ee,1,"json_object_clear failed");
    }
  }
  json_value_free(value);
  if (IVar1 == IOTHUB_REGISTRYMANAGER_OK) {
    IVar1 = IOTHUB_REGISTRYMANAGER_OK;
  }
  else {
    free_deviceOrModule_members(deviceOrModuleInfo);
  }
  return IVar1;
}

Assistant:

static IOTHUB_REGISTRYMANAGER_RESULT parseDeviceOrModuleJson(BUFFER_HANDLE jsonBuffer, IOTHUB_DEVICE_OR_MODULE* deviceOrModuleInfo)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if (jsonBuffer == NULL)
    {
        LogError("jsonBuffer cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else if (deviceOrModuleInfo == NULL)
    {
        LogError("deviceOrModuleInfo cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else
    {
        const char* bufferStr = NULL;
        JSON_Value* root_value = NULL;
        JSON_Object* root_object = NULL;
        JSON_Status jsonStatus;

        if ((bufferStr = (const char*)BUFFER_u_char(jsonBuffer)) == NULL)
        {
            LogError("BUFFER_u_char failed");
            result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
        }
        else if ((root_value = json_parse_string(bufferStr)) == NULL)
        {
            LogError("json_parse_string failed");
            result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
        }
        else if ((root_object = json_value_get_object(root_value)) == NULL)
        {
            LogError("json_value_get_object failed");
            result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
        }
        else
        {
            result = parseDeviceOrModuleJsonObject(root_object, deviceOrModuleInfo);
        }

        if ((jsonStatus = json_object_clear(root_object)) != JSONSuccess)
        {
            LogError("json_object_clear failed");
            result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
        }

        json_value_free(root_value);

        if (result != IOTHUB_REGISTRYMANAGER_OK)
        {
            free_deviceOrModule_members(deviceOrModuleInfo);
        }
    }
    return result;
}